

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O2

void __thiscall libtorrent::http_stream::connected(http_stream *this,error_code *e,handler_type *h)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  bool bVar3;
  endpoint *ep;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> p;
  string endpoint;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  pointer pcStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Manager_type p_Stack_b8;
  _Invoker_type local_b0;
  _Head_base<0UL,_libtorrent::http_stream_*,_false> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  bVar3 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar3) {
    local_100.container = &this->m_buffer;
    if (this->m_no_connect == true) {
      local_d8 = (undefined1  [8])
                 (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcStack_d0 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_c8._M_allocated_capacity =
           (size_type)
           (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      ((local_100.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_d8);
      std::function<void_(const_boost::system::error_code_&)>::operator()(h,e);
    }
    else {
      print_endpoint_abi_cxx11_
                (&local_38,(libtorrent *)&(this->super_proxy_base).m_remote_endpoint,ep);
      std::operator+(&local_f8,"CONNECT ",&local_38);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     &local_f8," HTTP/1.0\r\n");
      detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((string *)local_d8,&local_100);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      if ((this->m_user)._M_string_length != 0) {
        std::operator+(&local_98,&this->m_user,":");
        std::operator+(&local_78,&local_98,&this->m_password);
        base64encode(&local_58,&local_78);
        std::operator+(&local_f8,"Proxy-Authorization: Basic ",&local_58);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,&local_f8,"\r\n");
        detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((string *)local_d8,&local_100);
        std::__cxx11::string::~string((string *)local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d8,"\r\n",(allocator<char> *)&local_f8);
      detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((string *)local_d8,&local_100);
      std::__cxx11::string::~string((string *)local_d8);
      pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8._M_string_length =
           (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pcVar1;
      local_f8._M_dataplus._M_p = (pointer)0x0;
      if (local_f8._M_string_length != 0) {
        local_f8._M_dataplus._M_p = pcVar1;
      }
      local_d8 = (undefined1  [8])handshake1;
      pcStack_d0 = (pointer)0x0;
      local_c8._M_allocated_capacity = 0;
      local_c8._8_8_ = 0;
      p_Stack_b8 = (_Manager_type)0x0;
      local_b0 = h->_M_invoker;
      p_Var2 = (h->super__Function_base)._M_manager;
      if (p_Var2 != (_Manager_type)0x0) {
        local_c8._M_allocated_capacity = *(undefined8 *)&(h->super__Function_base)._M_functor;
        local_c8._8_8_ = *(undefined8 *)((long)&(h->super__Function_base)._M_functor + 8);
        (h->super__Function_base)._M_manager = (_Manager_type)0x0;
        h->_M_invoker = (_Invoker_type)0x0;
        p_Stack_b8 = p_Var2;
      }
      local_a8._M_head_impl = this;
      boost::asio::
      async_write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&)>>
                ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *)this,(mutable_buffers_1 *)&local_f8,
                 (_Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
                  *)local_d8,(type *)0x0);
      std::_Function_base::~_Function_base((_Function_base *)&local_c8);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void http_stream::connected(error_code const& e, handler_type& h)
	{
		if (handle_error(e, h)) return;

		using namespace libtorrent::detail;

		if (m_no_connect)
		{
			std::vector<char>().swap(m_buffer);
			h(e);
			return;
		}

		// send CONNECT
		std::back_insert_iterator<std::vector<char>> p(m_buffer);
		std::string const endpoint = print_endpoint(m_remote_endpoint);
		write_string("CONNECT " + endpoint + " HTTP/1.0\r\n", p);
		if (!m_user.empty())
		{
			write_string("Proxy-Authorization: Basic " + base64encode(
				m_user + ":" + m_password) + "\r\n", p);
		}
		write_string("\r\n", p);
		async_write(m_sock, boost::asio::buffer(m_buffer)
			, std::bind(&http_stream::handshake1, this, _1, std::move(h)));
	}